

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hash.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  ulong uVar2;
  code *pcVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  time_t tVar11;
  sx_alloc *alloc;
  sx_hashtbl *tbl;
  void *pvVar12;
  uint64_t uVar13;
  long *plVar14;
  char cVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  int iVar19;
  sx__hashtbl2 *_tbl;
  long lVar20;
  void *pvVar21;
  int i;
  int iVar22;
  long lVar23;
  char *pcVar24;
  sx_rng rng;
  sx_rng local_40;
  
  tVar11 = time((time_t *)0x0);
  sx_rng_seed(&local_40,(uint32_t)tVar11);
  sx_tm_init();
  alloc = sx_alloc_malloc();
  tbl = sx_hashtbl_create(alloc,10000);
  if (tbl == (sx_hashtbl *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x79,"tbl");
    pcVar3 = (code *)swi(3);
    iVar6 = (*pcVar3)();
    return iVar6;
  }
  pvVar12 = (*alloc->alloc_cb)((void *)0x0,320000,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
  if (pvVar12 == (void *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x7d,"items");
    pcVar3 = (code *)swi(3);
    iVar6 = (*pcVar3)();
    return iVar6;
  }
  puts("Generating random strings ...");
  lVar23 = 0;
  pvVar21 = pvVar12;
  do {
    uVar7 = sx_rng_gen(&local_40);
    lVar20 = 0;
    do {
      uVar8 = sx_rng_gen(&local_40);
      *(char *)((long)pvVar21 + lVar20) = (char)uVar8 + (char)(uVar8 / 0x4b) * -0x4b + '0';
      lVar20 = lVar20 + 1;
    } while ((ulong)(uVar7 & 0xf) + 0x10 != lVar20);
    *(undefined1 *)((long)pvVar12 + (ulong)(uVar7 & 0xf) + lVar23 * 0x20 + 0x10) = 0;
    lVar23 = lVar23 + 1;
    pvVar21 = (void *)((long)pvVar21 + 0x20);
  } while (lVar23 != 10000);
  puts("sx_hashtbl:");
  puts("\tPushing into hash table ...");
  uVar13 = sx_tm_now();
  pcVar24 = (char *)((long)pvVar12 + 1);
  lVar23 = 0;
  do {
    uVar17 = 0x811c9dc5;
    cVar15 = *(char *)((long)pvVar12 + lVar23 * 0x20);
    pcVar18 = pcVar24;
    while (cVar15 != '\0') {
      uVar17 = ((int)cVar15 ^ uVar17) * 0x1000193;
      cVar15 = *pcVar18;
      pcVar18 = pcVar18 + 1;
    }
    sx_hashtbl_add(tbl,uVar17,(int)lVar23);
    lVar23 = lVar23 + 1;
    pcVar24 = pcVar24 + 0x20;
  } while (lVar23 != 10000);
  uVar13 = sx_tm_since(uVar13);
  dVar4 = sx_tm_ms(uVar13);
  dVar5 = sx_tm_sec(uVar13);
  printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar4,0),SUB84(dVar5,0));
  puts("\tSearching for random items ...");
  uVar13 = sx_tm_now();
  pcVar24 = (char *)((long)pvVar12 + 1);
  iVar6 = 0;
  do {
    uVar7 = sx_rng_gen(&local_40);
    uVar17 = uVar7 % 10000;
    cVar15 = *(char *)((long)pvVar12 + (ulong)(uVar17 << 5));
    if (cVar15 == '\0') {
      uVar7 = 0x811c9dc5;
    }
    else {
      pcVar18 = pcVar24 + (ulong)uVar7 * 0x20 + ((ulong)uVar7 / 10000) * -320000;
      uVar7 = 0x811c9dc5;
      do {
        uVar7 = ((int)cVar15 ^ uVar7) * 0x1000193;
        cVar15 = *pcVar18;
        pcVar18 = pcVar18 + 1;
      } while (cVar15 != '\0');
    }
    lVar23 = (ulong)(uVar17 << 5) + (long)pvVar12;
    iVar9 = sx_hashtbl_find(tbl,uVar7);
    if (iVar9 == -1) {
LAB_001047ca:
      printf("\tERROR: Item not found: %s (index: %d)\n",lVar23,(ulong)uVar17);
    }
    else {
      uVar10 = tbl->values[iVar9];
      if (uVar10 == 0xffffffff || uVar10 == uVar17) {
        if (uVar10 == 0xffffffff) goto LAB_001047ca;
      }
      else {
        printf("\tERROR: Invalid hash result:\n\t\tRequested item: %s (index: %d)\n\t\tGot Item: %s (index: %d)\n"
               ,lVar23,(ulong)uVar17,(void *)((long)(int)uVar10 * 0x20 + (long)pvVar12));
      }
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 10000);
  uVar13 = sx_tm_since(uVar13);
  dVar4 = sx_tm_ms(uVar13);
  dVar5 = sx_tm_sec(uVar13);
  printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar4,0),SUB84(dVar5,0));
  printf("\tTotal miss count: %d\n\tTotal probe count: %d\n",(ulong)(uint)tbl->_miss_cnt,
         (ulong)(uint)tbl->_probe_cnt);
  plVar14 = (long *)(*alloc->alloc_cb)((void *)0x0,0x19670,0,(char *)0x0,(char *)0x0,0,
                                       alloc->user_data);
  if (plVar14 == (long *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c",
               0x21);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x21,"Out of memory");
    pcVar3 = (code *)swi(3);
    iVar6 = (*pcVar3)();
    return iVar6;
  }
  pvVar21 = (void *)((long)plVar14 + 0x27U & 0xfffffffffffffff8);
  *plVar14 = (long)pvVar21;
  plVar14[1] = (long)pvVar21 + 0xcb24;
  plVar14[2] = 0x32c900000000;
  plVar14[3] = 0;
  memset(pvVar21,0,0xcb24);
  puts("sx_hashtbl2:");
  puts("\tPushing into hash table ...");
  uVar13 = sx_tm_now();
  lVar23 = 0;
  do {
    uVar17 = 0x811c9dc5;
    cVar15 = *(char *)((long)pvVar12 + lVar23 * 0x20);
    pcVar18 = pcVar24;
    while (cVar15 != '\0') {
      uVar17 = ((int)cVar15 ^ uVar17) * 0x1000193;
      cVar15 = *pcVar18;
      pcVar18 = pcVar18 + 1;
    }
    if ((int)*(uint *)((long)plVar14 + 0x14) <= (int)plVar14[2]) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                        ,0x3d,"tbl->count < tbl->capacity");
      pcVar3 = (code *)swi(3);
      iVar6 = (*pcVar3)();
      return iVar6;
    }
    uVar10 = uVar17;
    do {
      uVar2 = (ulong)uVar10 % (ulong)*(uint *)((long)plVar14 + 0x14);
      uVar10 = (int)uVar2 + 1;
    } while (*(int *)(*plVar14 + uVar2 * 4) != 0);
    *(uint *)(*plVar14 + uVar2 * 4) = uVar17;
    *(int *)(plVar14[1] + uVar2 * 4) = (int)lVar23;
    *(int *)(plVar14 + 2) = (int)plVar14[2] + 1;
    lVar23 = lVar23 + 1;
    pcVar24 = pcVar24 + 0x20;
  } while (lVar23 != 10000);
  uVar13 = sx_tm_since(uVar13);
  dVar4 = sx_tm_ms(uVar13);
  dVar5 = sx_tm_sec(uVar13);
  printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar4,0),SUB84(dVar5,0));
  puts("\tSearching for random items ...");
  uVar13 = sx_tm_now();
  iVar6 = 0;
  do {
    uVar7 = sx_rng_gen(&local_40);
    uVar17 = uVar7 % 10000;
    cVar15 = *(char *)((long)pvVar12 + (ulong)(uVar17 << 5));
    if (cVar15 == '\0') {
      uVar10 = 0x811c9dc5;
    }
    else {
      pcVar24 = (char *)((long)pvVar12 + (ulong)uVar7 * 0x20 + ((ulong)uVar7 / 10000) * -320000 + 1)
      ;
      uVar10 = 0x811c9dc5;
      do {
        uVar10 = ((int)cVar15 ^ uVar10) * 0x1000193;
        cVar15 = *pcVar24;
        pcVar24 = pcVar24 + 1;
      } while (cVar15 != '\0');
    }
    lVar23 = (ulong)(uVar17 << 5) + (long)pvVar12;
    uVar1 = *(uint *)((long)plVar14 + 0x14);
    iVar9 = (int)((ulong)uVar10 % (ulong)uVar1);
    if (*(uint *)(*plVar14 + ((ulong)uVar10 % (ulong)uVar1) * 4) == uVar10) {
      lVar20 = (long)iVar9;
LAB_00104a93:
      uVar10 = *(uint *)(plVar14[1] + lVar20 * 4);
      if (uVar10 == 0xffffffff || uVar10 == uVar17) {
        if (uVar10 == 0xffffffff) goto LAB_00104b0f;
      }
      else {
        printf("\tERROR: Invalid hash result:\n\t\tRequested item: %s (index: %d)\n\t\tGot Item: %s (index: %d)\n"
               ,lVar23,(ulong)uVar17,(void *)((long)(int)uVar10 * 0x20 + (long)pvVar12));
      }
    }
    else {
      *(int *)(plVar14 + 3) = (int)plVar14[3] + 1;
      if (1 < uVar1) {
        iVar19 = *(int *)((long)plVar14 + 0x1c);
        iVar22 = uVar1 - 1;
        iVar16 = 1;
        do {
          iVar19 = iVar19 + 1;
          *(int *)((long)plVar14 + 0x1c) = iVar19;
          lVar20 = (long)(int)((uint)(iVar9 + iVar16) % uVar1);
          if (*(uint *)(*plVar14 + lVar20 * 4) == uVar10) goto LAB_00104a93;
          iVar16 = iVar16 + 1;
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
      }
LAB_00104b0f:
      printf("\tERROR: Item not found: %s (index: %d)\n",lVar23,(ulong)uVar17);
    }
    iVar6 = iVar6 + 1;
    if (iVar6 == 10000) {
      uVar13 = sx_tm_since(uVar13);
      dVar4 = sx_tm_ms(uVar13);
      dVar5 = sx_tm_sec(uVar13);
      printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar4,0),SUB84(dVar5,0));
      printf("\tTotal miss count: %d\n\tTotal probe count: %d\n",(ulong)*(uint *)(plVar14 + 3),
             (ulong)*(uint *)((long)plVar14 + 0x1c));
      sx_hashtbl_destroy(tbl,alloc);
      plVar14[2] = 0;
      (*alloc->alloc_cb)(plVar14,0,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
      sx_os_getch();
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
    sx_rng rng;
    sx_rng_seed(&rng, (uint32_t)time(NULL));
    sx_tm_init();

    const int num_samples = 10000;
    const sx_alloc* alloc = sx_alloc_malloc();
    sx_hashtbl* tbl = sx_hashtbl_create(alloc, num_samples);
    sx_assert(tbl);

    // Make random string array
    str_item* items = (str_item*)sx_malloc(alloc, sizeof(str_item) * num_samples);
    sx_assert(items);

    puts("Generating random strings ...");
    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        int num_chars = sx_rng_gen_rangei(&rng, 16, sizeof(item->str) - 1);
        for (int ii = 0; ii < num_chars; ii++) {
            char ch = (char)sx_rng_gen_rangei(&rng, 48, 122);
            sx_assert(ch >= 48 && ch <= 122);
            item->str[ii] = ch;
        }
        item->str[num_chars] = 0;
    }

    uint64_t start_tm, delta_tm;
    puts("sx_hashtbl:");
    puts("\tPushing into hash table ...");
    start_tm = sx_tm_now();

    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        sx_hashtbl_add(tbl, sx_hash_fnv32_str(item->str), i);
    }

    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));

    puts("\tSearching for random items ...");
    start_tm = sx_tm_now();
    for (int i = 0; i < num_samples; i++) {
        int index = sx_rng_gen_rangei(&rng, 0, num_samples - 1);
        int r = sx_hashtbl_find_get(tbl, sx_hash_fnv32_str(items[index].str), -1);
        if (r != index && r != -1) {
            printf(
                "\tERROR: Invalid hash result:\n"
                "\t\tRequested item: %s (index: %d)\n"
                "\t\tGot Item: %s (index: %d)\n",
                items[index].str, index, items[r].str, r);
        } else if (r == -1) {
            printf("\tERROR: Item not found: %s (index: %d)\n", items[index].str, index);
        }
    }
    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));
    if (sx_enabled(SX_CONFIG_HASHTBL_DEBUG))
        printf("\tTotal miss count: %d\n\tTotal probe count: %d\n", tbl->_miss_cnt,
               tbl->_probe_cnt);

    ////////////////////////////////////////////////////////////////////////////////////////////////
    // sx__hashtbl2
    sx__hashtbl2* tbl2 = sx__hashtbl2_create(alloc, num_samples);
    sx_assert(tbl2);

    puts("sx_hashtbl2:");
    puts("\tPushing into hash table ...");
    start_tm = sx_tm_now();

    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        sx__hashtbl2_add(tbl2, sx_hash_fnv32_str(item->str), i);
    }

    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));

    puts("\tSearching for random items ...");
    start_tm = sx_tm_now();
    for (int i = 0; i < num_samples; i++) {
        int index = sx_rng_gen_rangei(&rng, 0, num_samples - 1);
        int r = sx__hashtbl2_find_get(tbl2, sx_hash_fnv32_str(items[index].str), -1);
        if (r != index && r != -1) {
            printf(
                "\tERROR: Invalid hash result:\n"
                "\t\tRequested item: %s (index: %d)\n"
                "\t\tGot Item: %s (index: %d)\n",
                items[index].str, index, items[r].str, r);
        } else if (r == -1) {
            printf("\tERROR: Item not found: %s (index: %d)\n", items[index].str, index);
        }
    }
    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));
    if (sx_enabled(SX_CONFIG_HASHTBL_DEBUG))
        printf("\tTotal miss count: %d\n\tTotal probe count: %d\n", tbl2->_miss_cnt,
               tbl2->_probe_cnt);

    sx_hashtbl_destroy(tbl, alloc);
    sx__hashtbl2_destroy(tbl2, alloc);

    sx_os_getch();
    return 0;
}